

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

void make_ironbarwalls(level *lev,int chance)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  char local_16;
  char local_15;
  schar below;
  schar above;
  schar right;
  schar left;
  schar typ;
  xchar y;
  xchar x;
  int chance_local;
  level *lev_local;
  
  if (0 < chance) {
    for (local_15 = '\x01'; local_15 < 'O'; local_15 = local_15 + '\x01') {
      for (local_16 = '\x01'; local_16 < '\x14'; local_16 = local_16 + '\x01') {
        cVar1 = lev->locations[local_15][local_16].typ;
        cVar2 = lev->locations[local_15 + -1][local_16].typ;
        cVar3 = lev->locations[local_15 + 1][local_16].typ;
        cVar4 = lev->locations[local_15][local_16 + -1].typ;
        cVar5 = lev->locations[local_15][local_16 + 1].typ;
        if (cVar1 == '\x02') {
          if (((((cVar2 != '\0') && (cVar2 < '\r')) || (cVar2 == '\x16')) &&
              (((cVar3 != '\0' && (cVar3 < '\r')) || (cVar3 == '\x16')))) &&
             ((('\x17' < cVar4 && ('\x17' < cVar5)) && (iVar6 = rn2(100), iVar6 < chance)))) {
            lev->locations[local_15][local_16].typ = '\x16';
          }
        }
        else if (((cVar1 == '\x01') && (((cVar4 != '\0' && (cVar4 < '\r')) || (cVar4 == '\x16'))))
                && (((((cVar5 != '\0' && (cVar5 < '\r')) || (cVar5 == '\x16')) &&
                     (('\x17' < cVar2 && ('\x17' < cVar3)))) && (iVar6 = rn2(100), iVar6 < chance)))
                ) {
          lev->locations[local_15][local_16].typ = '\x16';
        }
      }
    }
  }
  return;
}

Assistant:

static void make_ironbarwalls(struct level *lev, int chance)
{
	xchar x, y;

	if (chance < 1) return;

	for (x = 1; x < COLNO - 1; x++) {
	    for(y = 1; y < ROWNO - 1; y++) {
		schar typ = lev->locations[x][y].typ;
		schar left = lev->locations[x - 1][y].typ;
		schar right = lev->locations[x + 1][y].typ;
		schar above = lev->locations[x][y - 1].typ;
		schar below = lev->locations[x][y + 1].typ;
		if (typ == HWALL) {
		    if ((IS_WALL(left)  || left  == IRONBARS) &&
			(IS_WALL(right) || right == IRONBARS) &&
			SPACE_POS(above) && SPACE_POS(below) &&
			rn2(100) < chance) {
			lev->locations[x][y].typ = IRONBARS;
		    }
		} else if (typ == VWALL) {
		    if ((IS_WALL(above) || above == IRONBARS) &&
			(IS_WALL(below) || below == IRONBARS) &&
			SPACE_POS(left) && SPACE_POS(right) &&
			rn2(100) < chance) {
			lev->locations[x][y].typ = IRONBARS;
		    }
		}
	    }
	}
}